

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::NotILikeOperatorASCII,bool>
               (string_t *ldata,string_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  byte bVar5;
  undefined1 auVar6 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  bool bVar8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  ulong uVar11;
  char *pdata;
  char *pcVar12;
  idx_t idx_in_entry;
  ulong uVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  undefined1 local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined8 local_58;
  char *local_50;
  bool *local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  ulong local_38;
  
  local_48 = result_data;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      uVar13 = 0;
      do {
        uVar9 = uVar13;
        if (psVar2 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar2[uVar13];
        }
        uVar11 = uVar13;
        if (psVar3 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar3[uVar13];
        }
        local_68 = *(undefined1 (*) [8])&ldata[uVar9].value;
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar9].value.pointer.ptr;
        local_58 = *(ulong *)&rdata[uVar11].value;
        local_50 = rdata[uVar11].value.pointer.ptr;
        pcVar12 = (char *)p_Stack_60;
        if (((ulong)local_68 & 0xffffffff) < 0xd) {
          pcVar12 = local_68 + 4;
        }
        pdata = local_50;
        if ((local_58 & 0xffffffff) < 0xd) {
          pdata = (char *)((long)&local_58 + 4);
        }
        bVar8 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::ASCIILCaseReader>
                          (pcVar12,(ulong)local_68 & 0xffffffff,pdata,local_58 & 0xffffffff,'\0');
        local_48[uVar13] = !bVar8;
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
    }
  }
  else if (count != 0) {
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar13 = 0;
    local_38 = count;
    do {
      uVar9 = uVar13;
      if (psVar2 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar2[uVar13];
      }
      uVar11 = uVar13;
      if (psVar3 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar3[uVar13];
      }
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) &&
         ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)))) {
        local_68 = *(undefined1 (*) [8])&ldata[uVar9].value;
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar9].value.pointer.ptr;
        local_58 = *(ulong *)&rdata[uVar11].value;
        local_50 = rdata[uVar11].value.pointer.ptr;
        p_Var14 = p_Stack_60;
        if (((ulong)local_68 & 0xffffffff) < 0xd) {
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 4);
        }
        pcVar12 = local_50;
        if ((local_58 & 0xffffffff) < 0xd) {
          pcVar12 = (char *)((long)&local_58 + 4);
        }
        bVar8 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::ASCIILCaseReader>
                          ((char *)p_Var14,(ulong)local_68 & 0xffffffff,pcVar12,
                           local_58 & 0xffffffff,'\0');
        local_48[uVar13] = !bVar8;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_68,&local_58);
          p_Var7 = p_Stack_60;
          auVar6 = local_68;
          local_68 = (undefined1  [8])0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var14 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar6;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
          }
          if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          count = local_38;
        }
        bVar5 = (byte)uVar13 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar13 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      uVar13 = uVar13 + 1;
    } while (count != uVar13);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}